

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::java::FileGenerator::ShouldIncludeDependency
          (FileGenerator *this,FileDescriptor *descriptor,bool immutable_api)

{
  bool bVar1;
  string_view sVar2;
  compiler *local_38;
  bool immutable_api_local;
  FileDescriptor *descriptor_local;
  FileGenerator *this_local;
  
  if (((this->options_).strip_nonfunctional_codegen & 1U) != 0) {
    sVar2 = FileDescriptor::name(descriptor);
    local_38 = (compiler *)sVar2._M_len;
    sVar2._M_len = (size_t)sVar2._M_str;
    bVar1 = IsKnownFeatureProto(local_38,sVar2);
    if (bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool FileGenerator::ShouldIncludeDependency(const FileDescriptor* descriptor,
                                            bool immutable_api) {
  // Skip feature imports, which are a visible (but non-functional) deviation
  // between editions and legacy syntax.
  if (options_.strip_nonfunctional_codegen &&
      IsKnownFeatureProto(descriptor->name())) {
    return false;
  }

  return true;
}